

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  Regexp **ppRVar4;
  Regexp *pRVar5;
  Regexp *pRVar6;
  uint nsub;
  StringPiece *pSVar7;
  ParseState *pPVar8;
  ParseState *re;
  ulong uVar9;
  long lVar10;
  ParseState *pPVar11;
  uint uVar12;
  undefined1 local_61 [13];
  RegexpOp local_54;
  ulong local_50;
  Regexp **local_48;
  ParseState *local_40;
  ParseState *local_38;
  
  pRVar5 = this->stacktop_;
  if ((pRVar5 == (Regexp *)0x0) || (bVar1 = pRVar5->op_, 0x15 < bVar1)) {
    pRVar6 = (Regexp *)0x0;
    nsub = 0;
  }
  else {
    nsub = 0;
    pRVar6 = pRVar5;
    do {
      uVar12 = 1;
      if (bVar1 == op) {
        uVar12 = (uint)pRVar6->nsub_;
      }
      nsub = nsub + uVar12;
      pRVar6 = pRVar6->down_;
    } while ((pRVar6 != (Regexp *)0x0) && (bVar1 = pRVar6->op_, bVar1 < 0x16));
  }
  if ((pRVar5 == (Regexp *)0x0) || (pRVar5->down_ != pRVar6)) {
    local_50 = (ulong)nsub;
    pPVar8 = (ParseState *)local_61;
    ppRVar4 = __gnu_cxx::new_allocator<re2::Regexp_*>::allocate
                        ((new_allocator<re2::Regexp_*> *)pPVar8,local_50,(void *)0x0);
    re = (ParseState *)this->stacktop_;
    pPVar11 = (ParseState *)0x0;
    local_61._1_8_ = ppRVar4;
    local_40 = this;
    if (re != (ParseState *)0x0) {
      uVar2 = (undefined1)re->flags_;
      if ((byte)uVar2 < (OneLine|ClassNL|Literal)) {
        local_48 = ppRVar4 + -1;
        local_54 = op;
        uVar12 = nsub;
        do {
          pPVar11 = (ParseState *)(re->whole_regexp_).size_;
          if ((byte)uVar2 == op) {
            uVar9 = (ulong)*(ushort *)&re->field_0x6;
            if (uVar9 < 2) {
              pSVar7 = &re->whole_regexp_;
            }
            else {
              pSVar7 = (StringPiece *)(re->whole_regexp_).data_;
            }
            local_38 = pPVar11;
            if (uVar9 != 0) {
              ppRVar4 = local_48 + (int)uVar12;
              lVar10 = uVar9 + 1;
              do {
                pRVar5 = Incref(*(Regexp **)((long)(pSVar7 + -1) + lVar10 * 8));
                *ppRVar4 = pRVar5;
                uVar12 = uVar12 - 1;
                ppRVar4 = ppRVar4 + -1;
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
            ppRVar4 = (Regexp **)local_61._1_8_;
            Decref((Regexp *)re);
            pPVar8 = re;
            re = local_38;
            op = local_54;
          }
          else {
            pRVar5 = FinishRegexp(pPVar8,(Regexp *)re);
            lVar10 = (long)(int)uVar12;
            uVar12 = uVar12 - 1;
            ppRVar4[lVar10 + -1] = pRVar5;
            re = pPVar11;
          }
          pPVar11 = re;
        } while ((re != (ParseState *)0x0) &&
                (uVar2 = (undefined1)re->flags_, (byte)uVar2 < (OneLine|ClassNL|Literal)));
      }
      else {
        pPVar11 = (ParseState *)0x0;
      }
    }
    pPVar8 = local_40;
    pRVar5 = ConcatOrAlternate(op,ppRVar4,nsub,local_40->flags_,true);
    bVar3 = ComputeSimple(pRVar5);
    pRVar5->simple_ = bVar3;
    pRVar5->down_ = (Regexp *)pPVar11;
    pPVar8->stacktop_ = pRVar5;
    if (ppRVar4 != (Regexp **)0x0) {
      operator_delete(ppRVar4,local_50 << 3);
    }
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  PODArray<Regexp*> subs(n);
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs.data(), n, flags_, true);
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}